

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynForEach * ParseForEach(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynForEachIterator> iterators_00;
  int iVar1;
  SynForEachIterator *node;
  SynBase *body;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *end;
  IntrusiveList<SynForEachIterator> iterators;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_for) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_1519a::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
    iterators.head = (SynForEachIterator *)0x0;
    iterators.tail = (SynForEachIterator *)0x0;
    node = ParseForEachIterator(ctx,true);
    if (node != (SynForEachIterator *)0x0) {
      do {
        IntrusiveList<SynForEachIterator>::push_back(&iterators,node);
        if (ctx->currentLexeme->type != lex_comma) goto LAB_001156de;
        ctx->currentLexeme = ctx->currentLexeme + 1;
        node = ParseForEachIterator(ctx,false);
      } while (node != (SynForEachIterator *)0x0);
      anon_unknown.dwarf_1519a::Report
                (ctx,ctx->currentLexeme,"ERROR: variable name or type expected before \'in\'");
LAB_001156de:
      anon_unknown.dwarf_1519a::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
      body = ParseExpression(ctx);
      if (body == (SynBase *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,ctx->currentLexeme,"ERROR: body not found after \'for\' header");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        body = (SynBase *)CONCAT44(extraout_var,iVar1);
        SynError::SynError((SynError *)body,ctx->currentLexeme,ctx->currentLexeme);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      end = ParseContext::Previous(ctx);
      iterators_00.tail = iterators.tail;
      iterators_00.head = iterators.head;
      SynForEach::SynForEach
                ((SynForEach *)CONCAT44(extraout_var_00,iVar1),begin,end,iterators_00,body);
      return (SynForEach *)CONCAT44(extraout_var_00,iVar1);
    }
    ctx->currentLexeme = begin;
  }
  return (SynForEach *)0x0;
}

Assistant:

SynForEach* ParseForEach(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		IntrusiveList<SynForEachIterator> iterators;

		SynForEachIterator *iterator = ParseForEachIterator(ctx, true);

		if(!iterator)
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		iterators.push_back(iterator);

		while(ctx.Consume(lex_comma))
		{
			iterator = ParseForEachIterator(ctx, false);

			if(!iterator)
			{
				Report(ctx, ctx.Current(), "ERROR: variable name or type expected before 'in'");

				break;
			}

			iterators.push_back(iterator);
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEach>()) SynForEach(start, ctx.Previous(), iterators, body);
	}

	return NULL;
}